

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::checkForVectoredSelect
          (ast *this,Expression *value,SourceRange range,ASTContext *context)

{
  int *piVar1;
  Diagnostic *this_00;
  SourceRange sourceRange;
  
  if ((((*(uint *)this & 0xfffffffe) == 8) && (piVar1 = *(int **)(this + 0x30), *piVar1 == 0x3b)) &&
     (piVar1[0x56] == 1)) {
    sourceRange.endLoc = range.startLoc;
    sourceRange.startLoc = (SourceLocation)value;
    this_00 = ASTContext::addDiag((ASTContext *)range.endLoc,(DiagCode)0x970007,sourceRange);
    Diagnostic::addNote(this_00,(DiagCode)0x50001,*(SourceLocation *)(piVar1 + 6));
    return;
  }
  return;
}

Assistant:

static void checkForVectoredSelect(const Expression& value, SourceRange range,
                                   const ASTContext& context) {
    if (value.kind != ExpressionKind::NamedValue && value.kind != ExpressionKind::HierarchicalValue)
        return;

    const Symbol& sym = value.as<ValueExpressionBase>().symbol;
    if (sym.kind == SymbolKind::Net && sym.as<NetSymbol>().expansionHint == NetSymbol::Vectored) {
        auto& diag = context.addDiag(diag::SelectOfVectoredNet, range);
        diag.addNote(diag::NoteDeclarationHere, sym.location);
    }
}